

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O2

Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,_std::nullptr_t> __thiscall
capnp::_::RpcSystemBase::RpcConnectionState::RpcCallContext::consumeRedirectedResponse
          (RpcCallContext *this)

{
  RpcCallContext *in_RSI;
  Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,_std::nullptr_t> OVar1;
  Fault f;
  DebugExpression<bool_&> _kjCondition;
  Fault local_48;
  Builder local_40;
  Maybe<capnp::MessageSize> local_28;
  
  local_40.builder.segment = (SegmentBuilder *)&in_RSI->redirectResults;
  if (in_RSI->redirectResults == false) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool&>&>
              (&local_48,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc.c++"
               ,0xc30,FAILED,"redirectResults","_kjCondition,",(DebugExpression<bool_&> *)&local_40)
    ;
    kj::_::Debug::Fault::fatal(&local_48);
  }
  if ((in_RSI->response).ptr.ptr == (RpcServerResponse *)0x0) {
    local_28.ptr.isSet = true;
    local_28.ptr.field_1.value.wordCount = 0;
    local_28.ptr.field_1.value.capCount = 0;
    getResults(&local_40,in_RSI,&local_28);
    if ((in_RSI->response).ptr.ptr == (RpcServerResponse *)0x0) {
      kj::_::Debug::Fault::Fault
                ((Fault *)&local_40,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc.c++"
                 ,0xc36,FAILED,"response != nullptr","");
      kj::_::Debug::Fault::fatal((Fault *)&local_40);
    }
  }
  OVar1 = LocallyRedirectedRpcResponse::addRef((LocallyRedirectedRpcResponse *)this);
  OVar1.disposer = (Disposer *)this;
  return OVar1;
}

Assistant:

kj::Own<RpcResponse> consumeRedirectedResponse() {
      KJ_ASSERT(redirectResults);

      if (response == kj::none) getResults(MessageSize{0, 0});  // force initialization of response

      // Note that the context needs to keep its own reference to the response so that it doesn't
      // get GC'd until the PipelineHook drops its reference to the context.
      return kj::downcast<LocallyRedirectedRpcResponse>(*KJ_ASSERT_NONNULL(response)).addRef();
    }